

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::update<QRect>(QWidgetPrivate *this,QRect r)

{
  undefined1 *puVar1;
  QWidgetData **ppQVar2;
  QWidget *widget;
  QWidgetData *pQVar3;
  QWidget *pQVar4;
  QRect QVar5;
  QEvent *this_00;
  long lVar6;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  int iVar9;
  undefined1 auVar8 [16];
  QRect local_58;
  undefined1 local_48 [24];
  QRect local_30;
  long local_20;
  
  QVar5._8_8_ = local_48._8_8_;
  QVar5._0_8_ = local_48._0_8_;
  local_30._8_8_ = r._8_8_;
  local_30._0_8_ = r._0_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&this->field_0x8;
  if (((*(uint *)&this->field_0x250 >> 0x18 & 1) == 0) ||
     ((widget->data->widget_attributes & 0x8000) != 0)) {
    pQVar3 = widget->data;
    if ((pQVar3->widget_attributes & 0x8400) == 0x8000) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.x2.m_i = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
      local_58.y2.m_i = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
      local_58.x1.m_i = 0;
      local_58.y1.m_i = 0;
      local_48._0_16_ = QRect::operator&(&local_30,&local_58);
      auVar8._0_4_ = -(uint)(local_48._8_4_ < local_48._0_4_);
      iVar9 = -(uint)(local_48._12_4_ < local_48._4_4_);
      auVar8._4_4_ = auVar8._0_4_;
      auVar8._8_4_ = iVar9;
      auVar8._12_4_ = iVar9;
      iVar9 = movmskpd(local_48._0_4_,auVar8);
      if (iVar9 == 0) {
        pQVar7 = widget;
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x243) & 0x40) == 0) {
          do {
            puVar1 = &pQVar7->field_0x8;
            pQVar4 = *(QWidget **)(*(long *)puVar1 + 0x10);
            if (pQVar4 == (QWidget *)0x0) break;
            ppQVar2 = &pQVar7->data;
            pQVar7 = pQVar4;
          } while ((((*ppQVar2)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
          lVar6 = *(long *)(*(long *)puVar1 + 0x78);
          if (lVar6 == 0) {
            lVar6 = 0;
          }
          else {
            lVar6 = *(long *)(lVar6 + 8);
          }
          if (((lVar6 != 0) && (*(long *)(lVar6 + 0x10) != 0)) &&
             (*(QWidgetRepaintManager **)(lVar6 + 8) != (QWidgetRepaintManager *)0x0)) {
            QWidgetRepaintManager::markDirty<QRect>
                      (*(QWidgetRepaintManager **)(lVar6 + 8),(QRect *)local_48,widget,UpdateLater,
                       BufferValid);
          }
        }
        else {
          this_00 = (QEvent *)operator_new(0x18);
          QRegion::QRegion((QRegion *)&local_58,(QRect *)local_48,Rectangle);
          QEvent::QEvent(this_00,UpdateLater);
          *(undefined ***)this_00 = &PTR__QUpdateLaterEvent_007f5d78;
          QRegion::QRegion((QRegion *)(this_00 + 0x10),(QRegion *)&local_58);
          QCoreApplication::postEvent(&widget->super_QObject,this_00,0);
          QRegion::~QRegion((QRegion *)&local_58);
        }
      }
    }
  }
  else {
    *(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 | 0x8000000;
    local_48._0_16_ = (undefined1  [16])QVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::update(T r)
{
    Q_Q(QWidget);

    if (renderToTexture && !q->isVisible()) {
        renderToTextureReallyDirty = 1;
        return;
    }

    if (!q->isVisible() || !q->updatesEnabled())
        return;

    T clipped = r & q->rect();

    if (clipped.isEmpty())
        return;

    if (q->testAttribute(Qt::WA_WState_InPaintEvent)) {
        QCoreApplication::postEvent(q, new QUpdateLaterEvent(clipped));
        return;
    }

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(clipped, q);
}